

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine.cpp
# Opt level: O1

unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
QFileSystemEngine::createLegacyEngine(QFileSystemEntry *entry,QFileSystemMetaData *data)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  QFileSystemEntry copy;
  undefined1 local_98 [32];
  QFileSystemEntry local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.m_filePath.d.d = *(Data **)data;
  local_78.m_filePath.d.ptr = (char16_t *)data->size_;
  local_78.m_filePath.d.size = data->accessTime_;
  if (&(local_78.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  local_78.m_nativeFilePath.d.d = (Data *)data->birthTime_;
  local_78.m_nativeFilePath.d.ptr = (char *)data->metadataChangeTime_;
  local_78.m_nativeFilePath.d.size = data->modificationTime_;
  if ((QArrayData *)local_78.m_nativeFilePath.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)local_78.m_nativeFilePath.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_78.m_nativeFilePath.d.d)->ref_)._q_value.super___atomic_base<int>.
         _M_i + 1;
    UNLOCK();
  }
  local_78._54_2_ = 0xaaaa;
  local_78.m_lastDotInFileName = (short)data->groupId_;
  local_78._48_4_ = data->userId_;
  (entry->m_filePath).d.d = (Data *)0x0;
  QFileSystemEntry::filePath((QString *)(local_98 + 8),&local_78);
  qt_custom_file_engine_handler_create((QString *)local_98);
  uVar1 = local_98._0_8_;
  local_98._0_8_ = (Data *)0x0;
  (entry->m_filePath).d.d = (Data *)uVar1;
  if ((QArrayData *)local_98._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._8_8_,2,0x10);
    }
  }
  QString::operator=((QString *)data,&local_78.m_filePath);
  QByteArray::operator=((QByteArray *)&data->birthTime_,&local_78.m_nativeFilePath);
  *(qint16 *)&data->groupId_ = local_78.m_lastDotInFileName;
  data->userId_ = local_78._48_4_;
  if (&(local_78.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_78.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_78.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_78.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
            )(__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
              )entry;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<QAbstractFileEngine>
QFileSystemEngine::createLegacyEngine(QFileSystemEntry &entry, QFileSystemMetaData &data)
{
    QFileSystemEntry copy = entry;
    std::unique_ptr<QAbstractFileEngine> engine;

    if (_q_createLegacyEngine_recursive(copy, data, engine))
        // Reset entry to resolved copy.
        entry = copy;
    else
        data.clear();

    return engine;
}